

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O1

void __thiscall
Assimp::IFCImporter::InternReadFile
          (IFCImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  string *__rhs;
  _Base_ptr *pp_Var1;
  size_type *psVar2;
  ObjectMapByType *this_00;
  pointer pcVar3;
  size_type sVar4;
  pointer pLVar5;
  undefined8 *puVar6;
  _Alloc_hider _Var7;
  pointer __src;
  pointer ppaVar8;
  pointer __src_00;
  pointer ppaVar9;
  undefined4 uVar10;
  int iVar11;
  uint uVar12;
  undefined4 extraout_var;
  long lVar13;
  long lVar14;
  size_t sVar15;
  uint8_t *puVar16;
  MemoryIOStream *__p;
  DB *db_00;
  long *plVar17;
  const_iterator cVar18;
  IfcUnitAssignment *pIVar19;
  IfcRepresentationContext *pIVar20;
  void *pvVar21;
  Object *pOVar22;
  aiNode *paVar23;
  undefined8 *puVar24;
  LazyObject *pLVar25;
  IfcObjectDefinition *pIVar26;
  aiNode *paVar27;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> _Var28;
  _Base_ptr p_Var29;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar30;
  char *pcVar31;
  aiNode **ppaVar32;
  aiMesh **__s;
  aiMaterial **__s_00;
  ulong *puVar33;
  undefined8 uVar34;
  ulong uVar35;
  char **ppcVar36;
  ulong uVar37;
  pointer pLVar38;
  bool bVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  pVar70;
  unique_ptr<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_> db;
  size_type __dnew;
  vector<aiNode_*,_std::allocator<aiNode_*>_> nodes;
  ConversionSchema schema;
  shared_ptr<Assimp::IOStream> stream;
  ConversionData conv;
  unz_file_info fileInfo;
  string local_498;
  undefined8 *local_478;
  iterator iStack_470;
  aiNode **local_468;
  _Base_ptr local_458;
  string local_450;
  float local_42c;
  float local_428;
  float local_424;
  float local_420;
  float local_41c;
  float local_418;
  float local_414;
  float local_410;
  float local_40c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  undefined1 local_3e8 [32];
  _Base_ptr local_3c8;
  size_t local_3c0;
  __shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  shared_ptr<Assimp::IOStream> local_388;
  undefined1 local_378 [112];
  double local_308;
  double dStack_300;
  double local_2f8;
  double local_2f0;
  double dStack_2e8;
  _func_int **local_2e0;
  _Base_bitset<1UL> _Stack_2d8;
  double local_2d0;
  pointer local_2c8;
  pointer ppaStack_2c0;
  pointer local_2b8;
  pointer ppaStack_2b0;
  pointer local_2a8;
  pointer ppaStack_2a0;
  _Rb_tree_node_base local_290;
  size_t local_270;
  _Rb_tree_node_base local_260;
  size_t local_240;
  Settings *local_238;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *local_230;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *pvStack_228;
  _Rb_tree_node_base local_218;
  size_t local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  undefined1 local_1c8 [4];
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1b8;
  undefined8 uStack_1a8;
  float local_1a0;
  undefined8 local_19c;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  ios_base local_158 [264];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_378._0_8_ = local_378 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"rb","");
  iVar11 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_378._0_8_);
  local_3b8._M_ptr = (element_type *)CONCAT44(extraout_var,iVar11);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::IOStream*>
            (&local_3b8._M_refcount,local_3b8._M_ptr);
  if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
    operator_delete((void *)local_378._0_8_);
  }
  if (local_3b8._M_ptr == (IOStream *)0x0) {
    local_378._0_8_ = local_378 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_378,"Could not open file for reading","");
    LogFunctions<Assimp::IFCImporter>::ThrowException((string *)local_378);
    if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
      operator_delete((void *)local_378._0_8_);
    }
  }
  BaseImporter::GetExtension((string *)local_378,pFile);
  iVar11 = std::__cxx11::string::compare(local_378);
  if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
    operator_delete((void *)local_378._0_8_);
  }
  if (iVar11 == 0) {
    lVar13 = unzOpen((pFile->_M_dataplus)._M_p);
    if (lVar13 == 0) {
      local_378._0_8_ = local_378 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_378,"Could not open ifczip file for reading, unzip failed","");
      LogFunctions<Assimp::IFCImporter>::ThrowException((string *)local_378);
      if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
        operator_delete((void *)local_378._0_8_);
      }
    }
    std::__cxx11::string::substr((ulong)local_3e8,(ulong)pFile);
    lVar14 = std::__cxx11::string::rfind((char)pFile,0x5c);
    if (lVar14 == -1) {
      lVar14 = std::__cxx11::string::rfind((char)pFile,0x2f);
    }
    if (lVar14 != -1) {
      std::__cxx11::string::substr((ulong)local_378,(ulong)local_3e8);
      std::__cxx11::string::operator=((string *)local_3e8,(string *)local_378);
      if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
        operator_delete((void *)local_378._0_8_);
      }
    }
    iVar11 = unzGoToFirstFile(lVar13);
    if (iVar11 == 0) {
      do {
        unzGetCurrentFileInfo(lVar13,local_1c8,local_378,0x100,0,0,0,0);
        local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
        sVar15 = strlen(local_378);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_450,local_378,local_378 + sVar15);
        BaseImporter::GetExtension(&local_498,&local_450);
        iVar11 = std::__cxx11::string::compare((char *)&local_498);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) {
          operator_delete(local_498._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_450._M_dataplus._M_p != &local_450.field_2) {
          operator_delete(local_450._M_dataplus._M_p);
        }
      } while (iVar11 != 0);
      puVar16 = (uint8_t *)operator_new__(CONCAT44(fStack_18c,fStack_190));
      LogFunctions<Assimp::IFCImporter>::LogInfo((char *)0x4d19ca);
      unzOpenCurrentFile(lVar13);
      lVar14 = 0;
      do {
        uVar37 = CONCAT44(fStack_18c,fStack_190);
        if (0x7ffe < uVar37) {
          uVar37 = 0x7fff;
        }
        pvVar21 = malloc(uVar37);
        uVar12 = unzReadCurrentFile(lVar13,pvVar21,uVar37 & 0xffffffff);
        if (0 < (int)uVar12) {
          memcpy(puVar16 + lVar14,pvVar21,(ulong)uVar12);
          lVar14 = lVar14 + (ulong)uVar12;
        }
        free(pvVar21);
      } while (0 < (int)uVar12);
      if ((lVar14 == 0) || (lVar14 != CONCAT44(fStack_18c,fStack_190))) {
        operator_delete__(puVar16);
        local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_498,"Failed to decompress IFC ZIP file","");
        LogFunctions<Assimp::IFCImporter>::ThrowException(&local_498);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) {
          operator_delete(local_498._M_dataplus._M_p);
        }
      }
      unzCloseCurrentFile(lVar13);
      __p = (MemoryIOStream *)Intern::AllocateFromAssimpHeap::operator_new(0x28);
      (__p->super_IOStream)._vptr_IOStream = (_func_int **)&PTR__MemoryIOStream_008969f0;
      __p->buffer = puVar16;
      __p->length = CONCAT44(fStack_18c,fStack_190);
      __p->pos = 0;
      __p->own = true;
      std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::reset<Assimp::MemoryIOStream>
                (&local_3b8,__p);
    }
    else {
      local_378._0_8_ = local_378 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_378,"Found no IFC file member in IFCZIP file (2)","");
      LogFunctions<Assimp::IFCImporter>::ThrowException((string *)local_378);
      if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
        operator_delete((void *)local_378._0_8_);
      }
    }
    unzClose(lVar13);
    if ((undefined1 *)local_3e8._0_8_ != local_3e8 + 0x10) {
      operator_delete((void *)local_3e8._0_8_);
    }
  }
  local_388.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_3b8._M_ptr;
  local_388.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_3b8._M_refcount._M_pi;
  if (local_3b8._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3b8._M_refcount._M_pi)->_M_use_count = (local_3b8._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3b8._M_refcount._M_pi)->_M_use_count = (local_3b8._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  db_00 = STEP::ReadFileHeader(&local_388);
  if (local_388.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_388.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  __rhs = &(db_00->header).fileSchema;
  if ((db_00->header).fileSchema._M_string_length == 0) {
    bVar39 = true;
  }
  else {
    std::__cxx11::string::substr((ulong)local_50,(ulong)__rhs);
    iVar11 = std::__cxx11::string::compare((char *)local_50);
    bVar39 = iVar11 != 0;
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  if (bVar39) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378,
                   "Unrecognized file schema: ",__rhs);
    LogFunctions<Assimp::IFCImporter>::ThrowException((string *)local_378);
    if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
      operator_delete((void *)local_378._0_8_);
    }
  }
  bVar39 = DefaultLogger::isNullLogger();
  if (!bVar39) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8,
                   "File schema is \'",__rhs);
    plVar17 = (long *)std::__cxx11::string::_M_replace_aux
                                ((ulong)local_3e8,CONCAT44(local_3e8._12_4_,local_3e8._8_4_),0,
                                 '\x01');
    paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar17 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar17 == paVar30) {
      sVar4 = paVar30->_M_allocated_capacity;
      lVar13 = plVar17[3];
      aStack_1b8._M_allocated_capacity._0_4_ = (undefined4)sVar4;
      aStack_1b8._M_local_buf[4] = (char)(sVar4 >> 0x20);
      aStack_1b8._M_allocated_capacity._5_2_ = (undefined2)(sVar4 >> 0x28);
      aStack_1b8._M_local_buf[7] = (char)(sVar4 >> 0x38);
      aStack_1b8._8_3_ = (undefined3)lVar13;
      aStack_1b8._M_local_buf[0xb] = (char)((ulong)lVar13 >> 0x18);
      aStack_1b8._12_4_ = (undefined4)((ulong)lVar13 >> 0x20);
      _local_1c8 = (pointer)&aStack_1b8;
    }
    else {
      sVar4 = paVar30->_M_allocated_capacity;
      aStack_1b8._M_allocated_capacity._0_4_ = (undefined4)sVar4;
      aStack_1b8._M_local_buf[4] = (char)(sVar4 >> 0x20);
      aStack_1b8._M_allocated_capacity._5_2_ = (undefined2)(sVar4 >> 0x28);
      aStack_1b8._M_local_buf[7] = (char)(sVar4 >> 0x38);
      _local_1c8 = (pointer)*plVar17;
    }
    fStack_1c0 = (float)plVar17[1];
    fStack_1bc = (float)((ulong)plVar17[1] >> 0x20);
    *plVar17 = (long)paVar30;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
    basic_formatter<std::__cxx11::string>
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_378,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8);
    LogFunctions<Assimp::IFCImporter>::LogDebug((format *)local_378);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
    std::ios_base::~ios_base((ios_base *)&local_308);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_1c8 != &aStack_1b8) {
      operator_delete(_local_1c8);
    }
    pcVar3 = local_3e8 + 0x10;
    if ((pointer)local_3e8._0_8_ != pcVar3) {
      operator_delete((void *)local_3e8._0_8_);
    }
    if ((db_00->header).timestamp._M_string_length != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8,
                     "Timestamp \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)db_00);
      plVar17 = (long *)std::__cxx11::string::_M_replace_aux
                                  ((ulong)local_3e8,CONCAT44(local_3e8._12_4_,local_3e8._8_4_),0,
                                   '\x01');
      paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar17 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar17 == paVar30) {
        sVar4 = paVar30->_M_allocated_capacity;
        lVar13 = plVar17[3];
        aStack_1b8._M_allocated_capacity._0_4_ = (undefined4)sVar4;
        aStack_1b8._M_local_buf[4] = (char)(sVar4 >> 0x20);
        aStack_1b8._M_allocated_capacity._5_2_ = (undefined2)(sVar4 >> 0x28);
        aStack_1b8._M_local_buf[7] = (char)(sVar4 >> 0x38);
        aStack_1b8._8_3_ = (undefined3)lVar13;
        aStack_1b8._M_local_buf[0xb] = (char)((ulong)lVar13 >> 0x18);
        aStack_1b8._12_4_ = (undefined4)((ulong)lVar13 >> 0x20);
        _local_1c8 = (pointer)&aStack_1b8;
      }
      else {
        sVar4 = paVar30->_M_allocated_capacity;
        aStack_1b8._M_allocated_capacity._0_4_ = (undefined4)sVar4;
        aStack_1b8._M_local_buf[4] = (char)(sVar4 >> 0x20);
        aStack_1b8._M_allocated_capacity._5_2_ = (undefined2)(sVar4 >> 0x28);
        aStack_1b8._M_local_buf[7] = (char)(sVar4 >> 0x38);
        _local_1c8 = (pointer)*plVar17;
      }
      fStack_1c0 = (float)plVar17[1];
      fStack_1bc = (float)((ulong)plVar17[1] >> 0x20);
      *plVar17 = (long)paVar30;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
      basic_formatter<std::__cxx11::string>
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_378,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8);
      LogFunctions<Assimp::IFCImporter>::LogDebug((format *)local_378);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
      std::ios_base::~ios_base((ios_base *)&local_308);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_1c8 != &aStack_1b8) {
        operator_delete(_local_1c8);
      }
      if ((pointer)local_3e8._0_8_ != pcVar3) {
        operator_delete((void *)local_3e8._0_8_);
      }
    }
    if ((db_00->header).app._M_string_length != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8,
                     "Application/Exporter identline is \'",&(db_00->header).app);
      plVar17 = (long *)std::__cxx11::string::_M_replace_aux
                                  ((ulong)local_3e8,CONCAT44(local_3e8._12_4_,local_3e8._8_4_),0,
                                   '\x01');
      paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar17 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar17 == paVar30) {
        sVar4 = paVar30->_M_allocated_capacity;
        lVar13 = plVar17[3];
        aStack_1b8._M_allocated_capacity._0_4_ = (undefined4)sVar4;
        aStack_1b8._M_local_buf[4] = (char)(sVar4 >> 0x20);
        aStack_1b8._M_allocated_capacity._5_2_ = (undefined2)(sVar4 >> 0x28);
        aStack_1b8._M_local_buf[7] = (char)(sVar4 >> 0x38);
        aStack_1b8._8_3_ = (undefined3)lVar13;
        aStack_1b8._M_local_buf[0xb] = (char)((ulong)lVar13 >> 0x18);
        aStack_1b8._12_4_ = (undefined4)((ulong)lVar13 >> 0x20);
        _local_1c8 = (pointer)&aStack_1b8;
      }
      else {
        sVar4 = paVar30->_M_allocated_capacity;
        aStack_1b8._M_allocated_capacity._0_4_ = (undefined4)sVar4;
        aStack_1b8._M_local_buf[4] = (char)(sVar4 >> 0x20);
        aStack_1b8._M_allocated_capacity._5_2_ = (undefined2)(sVar4 >> 0x28);
        aStack_1b8._M_local_buf[7] = (char)(sVar4 >> 0x38);
        _local_1c8 = (pointer)*plVar17;
      }
      fStack_1c0 = (float)plVar17[1];
      fStack_1bc = (float)((ulong)plVar17[1] >> 0x20);
      *plVar17 = (long)paVar30;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
      basic_formatter<std::__cxx11::string>
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_378,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8);
      LogFunctions<Assimp::IFCImporter>::LogDebug((format *)local_378);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
      std::ios_base::~ios_base((ios_base *)&local_308);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_1c8 != &aStack_1b8) {
        operator_delete(_local_1c8);
      }
      if ((pointer)local_3e8._0_8_ != pcVar3) {
        operator_delete((void *)local_3e8._0_8_);
      }
    }
  }
  local_3e8._24_8_ = local_3e8 + 8;
  local_3e8._8_4_ = _S_red;
  local_3e8._16_8_ = 0;
  local_3c0 = 0;
  local_3c8 = (_Base_ptr)local_3e8._24_8_;
  Assimp::IFC::Schema_2x3::GetSchema((ConversionSchema *)local_3e8);
  ppcVar36 = InternReadFile::inverse_indices_to_track;
  STEP::ReadFile(db_00,(ConversionSchema *)local_3e8,InternReadFile::types_to_track,3,
                 InternReadFile::inverse_indices_to_track,6);
  local_378._0_8_ = local_378 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"ifcproject","");
  cVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
           ::find(&(db_00->objects_bytype)._M_t,(key_type *)local_378);
  if (((_Rb_tree_header *)cVar18._M_node ==
       &(db_00->objects_bytype)._M_t._M_impl.super__Rb_tree_header) ||
     (cVar18._M_node[3]._M_parent == (_Base_ptr)0x0)) {
    pLVar25 = (LazyObject *)0x0;
  }
  else {
    pLVar25 = *(LazyObject **)(cVar18._M_node[2]._M_right + 1);
  }
  if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
    operator_delete((void *)local_378._0_8_);
  }
  if (pLVar25 == (LazyObject *)0x0) {
    local_378._0_8_ = local_378 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_378,"missing IfcProject entity","");
    LogFunctions<Assimp::IFCImporter>::ThrowException((string *)local_378);
    if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
      operator_delete((void *)local_378._0_8_);
    }
  }
  local_378._32_8_ = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcProject>(pLVar25);
  local_238 = &this->settings;
  local_290._M_left = &local_290;
  local_378._0_8_ = (pointer)0x3ff0000000000000;
  local_378._8_8_ = -1.0;
  local_378._48_8_ = 1.0;
  local_378._56_8_ = 0.0;
  local_378._64_8_ = 0.0;
  local_378._72_8_ = 0.0;
  local_378._80_8_ = 0.0;
  local_378._88_8_ = 1.0;
  local_378._96_8_ = 0.0;
  local_378._104_8_ = 0.0;
  local_308 = 0.0;
  dStack_300 = 0.0;
  local_2f8 = 1.0;
  local_2f0 = 0.0;
  dStack_2e8 = 0.0;
  local_2e0 = (_func_int **)0x0;
  _Stack_2d8._M_w = 0;
  local_2d0 = 1.0;
  local_290._M_color = _S_red;
  local_290._M_parent = (_Base_ptr)0x0;
  local_2a8 = (pointer)0x0;
  ppaStack_2a0 = (pointer)0x0;
  local_2b8 = (pointer)0x0;
  ppaStack_2b0 = (pointer)0x0;
  local_2c8 = (pointer)0x0;
  ppaStack_2c0 = (pointer)0x0;
  local_270 = 0;
  local_260._M_left = &local_260;
  local_260._M_color = _S_red;
  local_260._M_parent = (_Base_ptr)0x0;
  local_240 = 0;
  local_218._M_left = &local_218;
  local_218._M_color = _S_red;
  local_218._M_parent = (_Base_ptr)0x0;
  local_230 = (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)0x0;
  pvStack_228 = (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)0x0;
  local_1f8 = 0;
  local_378._24_8_ = db_00;
  local_378._40_8_ = pScene;
  local_290._M_right = local_290._M_left;
  local_260._M_right = local_260._M_left;
  local_218._M_right = local_218._M_left;
  pIVar19 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcUnitAssignment>
                      ((((IfcProject *)local_378._32_8_)->UnitsInContext).obj);
  if (*(long *)&(pIVar19->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcUnitAssignment,_1UL>).
                field_0x18 !=
      *(long *)&(pIVar19->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcUnitAssignment,_1UL>).
                field_0x10) {
    lVar13 = 0;
    uVar37 = 0;
    do {
      pIVar19 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcUnitAssignment>
                          (((Lazy<Assimp::IFC::Schema_2x3::IfcUnitAssignment> *)
                           (local_378._32_8_ + 0x148))->obj);
      anon_unknown.dwarf_a9e8ec::ConvertUnit
                (*(DataType **)
                  (*(long *)&(pIVar19->
                             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcUnitAssignment,_1UL>).
                             field_0x10 + lVar13),(ConversionData *)local_378);
      pIVar19 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcUnitAssignment>
                          (((Lazy<Assimp::IFC::Schema_2x3::IfcUnitAssignment> *)
                           (local_378._32_8_ + 0x148))->obj);
      uVar37 = uVar37 + 1;
      lVar13 = lVar13 + 0x10;
    } while (uVar37 < (ulong)(*(long *)&(pIVar19->
                                        super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcUnitAssignment,_1UL>
                                        ).field_0x18 -
                              *(long *)&(pIVar19->
                                        super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcUnitAssignment,_1UL>
                                        ).field_0x10 >> 4));
  }
  pLVar38 = (((ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>,_1UL,_0UL>
               *)(local_378._32_8_ + 0x130))->
            super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>_>_>
            ).
            super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pLVar5 = (((ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>,_1UL,_0UL>
              *)(local_378._32_8_ + 0x130))->
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>_>_>
           ).
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pLVar38 == pLVar5) {
    pIVar20 = (IfcRepresentationContext *)0x0;
  }
  else {
    do {
      pIVar20 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcRepresentationContext>
                          (pLVar38->obj);
      if ((pIVar20->ContextType).have == true) {
        iVar11 = std::__cxx11::string::compare((char *)&pIVar20->ContextType);
        if (iVar11 == 0) break;
      }
      pLVar38 = pLVar38 + 1;
    } while (pLVar38 != pLVar5);
  }
  if (pIVar20 != (IfcRepresentationContext *)0x0) {
    lVar13 = __dynamic_cast((_func_int *)
                            ((long)&(pIVar20->
                                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>
                                    )._vptr_ObjectHelper +
                            (long)(pIVar20->
                                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>
                                  )._vptr_ObjectHelper[-3]),&STEP::Object::typeinfo,
                            &Assimp::IFC::Schema_2x3::IfcGeometricRepresentationContext::typeinfo,
                            0xffffffffffffffff);
    if (lVar13 != 0) {
      Assimp::IFC::ConvertAxisPlacement
                ((IfcMatrix4 *)(local_378 + 0x30),*(IfcAxis2Placement **)(lVar13 + 0x88),
                 (ConversionData *)local_378);
      LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x4d2234);
    }
  }
  uVar34 = local_378._24_8_;
  this_00 = (ObjectMapByType *)(local_378._24_8_ + 0x90);
  aStack_1b8._M_allocated_capacity._0_4_ = 0x73636669;
  aStack_1b8._M_local_buf[4] = 'i';
  aStack_1b8._M_allocated_capacity._5_2_ = 0x6574;
  fStack_1c0 = 9.80909e-45;
  fStack_1bc = 0.0;
  aStack_1b8._7_4_ = aStack_1b8._7_4_ & 0xffffff00;
  _local_1c8 = (pointer)&aStack_1b8;
  cVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
                   *)this_00,(key_type *)local_1c8);
  if (cVar18._M_node == (_Base_ptr)(uVar34 + 0x98)) {
    __assert_fail("map.find(\"ifcsite\") != map.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCLoader.cpp"
                  ,0x374,"void (anonymous namespace)::ProcessSpatialStructures(ConversionData &)");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_local_1c8 != &aStack_1b8) {
    operator_delete(_local_1c8);
  }
  aStack_1b8._M_allocated_capacity._0_4_ = 0x73636669;
  aStack_1b8._M_local_buf[4] = 'i';
  aStack_1b8._M_allocated_capacity._5_2_ = 0x6574;
  fStack_1c0 = 9.80909e-45;
  fStack_1bc = 0.0;
  aStack_1b8._7_4_ = aStack_1b8._7_4_ & 0xffffff00;
  _local_1c8 = (pointer)&aStack_1b8;
  cVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
                   *)this_00,(key_type *)local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_local_1c8 != &aStack_1b8) {
    operator_delete(_local_1c8);
  }
  if (cVar18._M_node[3]._M_parent == (_Base_ptr)0x0) {
    aStack_1b8._M_allocated_capacity._0_4_ = 0x62636669;
    aStack_1b8._M_local_buf[4] = 'u';
    aStack_1b8._M_allocated_capacity._5_2_ = 0x6c69;
    aStack_1b8._7_4_ = 0x676e6964;
    fStack_1c0 = 1.54143e-44;
    fStack_1bc = 0.0;
    aStack_1b8._M_local_buf[0xb] = '\0';
    _local_1c8 = (pointer)&aStack_1b8;
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
                     *)this_00,(key_type *)local_1c8);
    if (cVar18._M_node == (_Base_ptr)(uVar34 + 0x98)) {
      __assert_fail("map.find(\"ifcbuilding\") != map.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCLoader.cpp"
                    ,0x378,"void (anonymous namespace)::ProcessSpatialStructures(ConversionData &)")
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_1c8 != &aStack_1b8) {
      operator_delete(_local_1c8);
    }
    aStack_1b8._M_allocated_capacity._0_4_ = 0x62636669;
    aStack_1b8._M_local_buf[4] = 'u';
    aStack_1b8._M_allocated_capacity._5_2_ = 0x6c69;
    aStack_1b8._7_4_ = 0x676e6964;
    fStack_1c0 = 1.54143e-44;
    fStack_1bc = 0.0;
    aStack_1b8._M_local_buf[0xb] = '\0';
    _local_1c8 = (pointer)&aStack_1b8;
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
                     *)this_00,(key_type *)local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_1c8 != &aStack_1b8) {
      operator_delete(_local_1c8);
    }
    if (cVar18._M_node[3]._M_parent == (_Base_ptr)0x0) {
      local_498._M_dataplus._M_p = (pointer)0x42;
      _local_1c8 = (pointer)&aStack_1b8;
      pvVar21 = (void *)std::__cxx11::string::_M_create((ulong *)local_1c8,(ulong)&local_498);
      _Var7._M_p = local_498._M_dataplus._M_p;
      local_1c8 = SUB84(pvVar21,0);
      fStack_1c4 = (float)((ulong)pvVar21 >> 0x20);
      aStack_1b8._M_allocated_capacity._0_4_ = SUB84(local_498._M_dataplus._M_p,0);
      uVar10 = aStack_1b8._M_allocated_capacity._0_4_;
      aStack_1b8._M_local_buf[4] = (char)((ulong)local_498._M_dataplus._M_p >> 0x20);
      aStack_1b8._M_allocated_capacity._5_2_ =
           (undefined2)((ulong)local_498._M_dataplus._M_p >> 0x28);
      aStack_1b8._M_local_buf[7] = (char)((ulong)local_498._M_dataplus._M_p >> 0x38);
      memcpy(pvVar21,"no root element found (expected IfcBuilding or preferably IfcSite)",0x42);
      fStack_1bc = (float)((ulong)_Var7._M_p >> 0x20);
      *(char *)((long)pvVar21 + (long)_Var7._M_p) = '\0';
      fStack_1c0 = (float)uVar10;
      LogFunctions<Assimp::IFCImporter>::ThrowException((string *)local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_1c8 != &aStack_1b8) {
        operator_delete(_local_1c8);
      }
    }
  }
  local_478 = (undefined8 *)0x0;
  iStack_470._M_current = (aiNode **)0x0;
  local_468 = (aiNode **)0x0;
  p_Var29 = cVar18._M_node[2]._M_right;
  pp_Var1 = &cVar18._M_node[2]._M_parent;
  local_458 = cVar18._M_node;
  if (p_Var29 != (_Base_ptr)pp_Var1) {
    do {
      pOVar22 = STEP::LazyObject::operator*(*(LazyObject **)(p_Var29 + 1));
      paVar23 = (aiNode *)
                __dynamic_cast(pOVar22,&STEP::Object::typeinfo,
                               &Assimp::IFC::Schema_2x3::IfcSpatialStructureElement::typeinfo,
                               0xffffffffffffffff);
      _Var7._M_p = _local_1c8;
      if (paVar23 != (aiNode *)0x0) {
        if ((paVar23->mName).data[0x54] == '\x01') {
          local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
          lVar13 = *(long *)((paVar23->mName).data + 0x34);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3a8,lVar13,*(long *)((paVar23->mName).data + 0x3c) + lVar13);
        }
        else {
          local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
          local_3a8.field_2._M_allocated_capacity._4_3_ = 0x64656d;
          local_3a8.field_2._M_allocated_capacity._0_4_ = 0x616e6e75;
          local_3a8._M_string_length = 7;
          local_3a8.field_2._M_local_buf[7] = '\0';
        }
        std::operator+(&local_1e8,"looking at spatial structure `",&local_3a8);
        paVar30 = &local_450.field_2;
        plVar17 = (long *)std::__cxx11::string::append((char *)&local_1e8);
        puVar33 = (ulong *)(plVar17 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar17 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar33) {
          local_450.field_2._M_allocated_capacity = *puVar33;
          local_450.field_2._8_8_ = plVar17[3];
          local_450._M_dataplus._M_p = (pointer)paVar30;
        }
        else {
          local_450.field_2._M_allocated_capacity = *puVar33;
          local_450._M_dataplus._M_p = (pointer)*plVar17;
        }
        local_450._M_string_length = plVar17[1];
        *plVar17 = (long)puVar33;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        if ((paVar23->mName).data[0xc4] == '\x01') {
          std::operator+(&local_408," which is of type ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((paVar23->mName).data + 0xa4));
        }
        else {
          local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
          local_408._M_string_length = 0;
          local_408.field_2._M_local_buf[0] = '\0';
        }
        uVar34 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_450._M_dataplus._M_p != paVar30) {
          uVar34 = local_450.field_2._M_allocated_capacity;
        }
        uVar37 = (long)&(((_Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                           *)local_450._M_string_length)->_M_impl).super__Vector_impl_data._M_start
                 + local_408._M_string_length;
        ppcVar36 = (char **)local_450._M_string_length;
        if ((ulong)uVar34 < uVar37) {
          uVar35 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._M_dataplus._M_p != &local_408.field_2) {
            uVar35 = CONCAT71(local_408.field_2._M_allocated_capacity._1_7_,
                              local_408.field_2._M_local_buf[0]);
          }
          if (uVar35 < uVar37) goto LAB_004d2611;
          puVar24 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_408,0,(char *)0x0,(ulong)local_450._M_dataplus._M_p);
        }
        else {
LAB_004d2611:
          puVar24 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_450,(ulong)local_408._M_dataplus._M_p);
        }
        psVar2 = puVar24 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar24 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar2) {
          local_498.field_2._M_allocated_capacity = *psVar2;
          local_498.field_2._8_8_ = puVar24[3];
          local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
        }
        else {
          local_498.field_2._M_allocated_capacity = *psVar2;
          local_498._M_dataplus._M_p = (pointer)*puVar24;
        }
        local_498._M_string_length = puVar24[1];
        *puVar24 = psVar2;
        puVar24[1] = 0;
        *(undefined1 *)psVar2 = 0;
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
        basic_formatter<std::__cxx11::string>
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1c8,
                   &local_498);
        LogFunctions<Assimp::IFCImporter>::LogDebug((format *)local_1c8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
        std::ios_base::~ios_base(local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) {
          operator_delete(local_498._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != &local_408.field_2) {
          operator_delete(local_408._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_450._M_dataplus._M_p != paVar30) {
          operator_delete(local_450._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
          operator_delete(local_3a8._M_dataplus._M_p);
        }
        uVar34 = *(undefined8 *)
                  (&((IfcObject *)local_378._32_8_)->field_0x8 +
                  *(long *)(*(long *)(IfcObject *)local_378._32_8_ + -0x18));
        local_1c8 = SUB84(uVar34,0);
        fStack_1c4 = (float)((ulong)uVar34 >> 0x20);
        pVar70 = std::
                 _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                 ::equal_range((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                *)(local_378._24_8_ + 0xc0),(key_type_conflict1 *)local_1c8);
        _Var7._M_p = (pointer)CONCAT44(fStack_1c4,local_1c8);
        _Var28 = pVar70.first._M_node;
        while (_Var28._M_node != pVar70.second._M_node._M_node) {
          pLVar25 = STEP::DB::GetObject((DB *)local_378._24_8_,(uint64_t)_Var28._M_node[1]._M_parent
                                       );
          pOVar22 = STEP::LazyObject::operator*(pLVar25);
          lVar13 = __dynamic_cast(pOVar22,&STEP::Object::typeinfo,
                                  &Assimp::IFC::Schema_2x3::IfcRelAggregates::typeinfo,
                                  0xffffffffffffffff);
          if (lVar13 != 0) {
            puVar6 = *(undefined8 **)(lVar13 + 0xb8);
            for (puVar24 = *(undefined8 **)(lVar13 + 0xb0); puVar24 != puVar6; puVar24 = puVar24 + 1
                ) {
              pIVar26 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcObjectDefinition>
                                  ((LazyObject *)*puVar24);
              if (*(long *)((long)&(pIVar26->super_IfcRoot).
                                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                                   aux_is_derived.super__Base_bitset<1UL>._M_w +
                           (long)(pIVar26->super_IfcRoot).
                                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                                 _vptr_ObjectHelper[-3]) ==
                  *(long *)((paVar23->mName).data + *(long *)(*(long *)&paVar23->mName + -0x18) + 4)
                 ) {
                LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x4d27f8);
                paVar27 = anon_unknown.dwarf_a9e8ec::ProcessSpatialStructure
                                    ((anon_unknown_dwarf_a9e8ec *)0x0,paVar23,
                                     (IfcProduct *)local_378,(ConversionData *)0x0,
                                     (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                                      *)ppcVar36);
                local_1c8 = SUB84(paVar27,0);
                fStack_1c4 = (float)((ulong)paVar27 >> 0x20);
                if (iStack_470._M_current == local_468) {
                  std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*>
                            ((vector<aiNode*,std::allocator<aiNode*>> *)&local_478,iStack_470,
                             (aiNode **)local_1c8);
                }
                else {
                  *iStack_470._M_current = paVar27;
                  iStack_470._M_current = iStack_470._M_current + 1;
                }
              }
            }
          }
          _Var28._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var28._M_node);
          _Var7._M_p = (pointer)CONCAT44(fStack_1c4,local_1c8);
        }
      }
      _local_1c8 = _Var7._M_p;
      p_Var29 = (_Base_ptr)std::_Rb_tree_increment(p_Var29);
    } while (p_Var29 != (_Base_ptr)pp_Var1);
  }
  lVar13 = (long)iStack_470._M_current - (long)local_478;
  if (lVar13 == 0) {
    LogFunctions<Assimp::IFCImporter>::LogWarn((char *)0x4d2898);
    p_Var29 = local_458[2]._M_right;
    if (p_Var29 != (_Base_ptr)pp_Var1) {
      do {
        pOVar22 = STEP::LazyObject::operator*(*(LazyObject **)(p_Var29 + 1));
        paVar23 = (aiNode *)
                  __dynamic_cast(pOVar22,&STEP::Object::typeinfo,
                                 &Assimp::IFC::Schema_2x3::IfcSpatialStructureElement::typeinfo);
        if (paVar23 != (aiNode *)0x0) {
          paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)anon_unknown.dwarf_a9e8ec::ProcessSpatialStructure
                                 ((anon_unknown_dwarf_a9e8ec *)0x0,paVar23,(IfcProduct *)local_378,
                                  (ConversionData *)0x0,
                                  (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                                   *)ppcVar36);
          _local_1c8 = (pointer)paVar30;
          if (iStack_470._M_current == local_468) {
            std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*>
                      ((vector<aiNode*,std::allocator<aiNode*>> *)&local_478,iStack_470,
                       (aiNode **)local_1c8);
          }
          else {
            *iStack_470._M_current = (aiNode *)paVar30;
            iStack_470._M_current = iStack_470._M_current + 1;
          }
        }
        p_Var29 = (_Base_ptr)std::_Rb_tree_increment(p_Var29);
      } while (p_Var29 != (_Base_ptr)pp_Var1);
    }
    lVar13 = (long)iStack_470._M_current - (long)local_478;
  }
  lVar14 = lVar13 >> 3;
  if (lVar14 == 0) {
    local_498._M_dataplus._M_p = (pointer)0x28;
    _local_1c8 = (pointer)&aStack_1b8;
    pcVar31 = (char *)std::__cxx11::string::_M_create((ulong *)local_1c8,(ulong)&local_498);
    local_1c8 = SUB84(pcVar31,0);
    fStack_1c4 = (float)((ulong)pcVar31 >> 0x20);
    aStack_1b8._M_allocated_capacity._0_4_ = SUB84(local_498._M_dataplus._M_p,0);
    aStack_1b8._M_local_buf[4] = (char)((ulong)local_498._M_dataplus._M_p >> 0x20);
    aStack_1b8._M_allocated_capacity._5_2_ = (undefined2)((ulong)local_498._M_dataplus._M_p >> 0x28)
    ;
    aStack_1b8._M_local_buf[7] = (char)((ulong)local_498._M_dataplus._M_p >> 0x38);
    builtin_strncpy(pcVar31,"failed to determine primary site element",0x28);
    fStack_1bc = (float)((ulong)local_498._M_dataplus._M_p >> 0x20);
    pcVar31[(long)local_498._M_dataplus._M_p] = '\0';
    fStack_1c0 = (float)aStack_1b8._M_allocated_capacity._0_4_;
    LogFunctions<Assimp::IFCImporter>::ThrowException((string *)local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_1c8 != &aStack_1b8) {
      operator_delete(_local_1c8);
    }
  }
  else if (lVar14 == 1) {
    *(aiNode **)(local_378._40_8_ + 8) = (aiNode *)*local_478;
  }
  else {
    paVar23 = (aiNode *)operator_new(0x478);
    aStack_1b8._M_allocated_capacity._0_4_ = 0x746f6f52;
    fStack_1c0 = 5.60519e-45;
    fStack_1bc = 0.0;
    aStack_1b8._M_local_buf[4] = '\0';
    _local_1c8 = (pointer)&aStack_1b8;
    aiNode::aiNode(paVar23,(string *)local_1c8);
    *(aiNode **)(local_378._40_8_ + 8) = paVar23;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_1c8 != &aStack_1b8) {
      operator_delete(_local_1c8);
    }
    uVar34 = local_378._40_8_;
    (*(aiNode **)(local_378._40_8_ + 8))->mParent = (aiNode *)0x0;
    (*(aiNode **)(local_378._40_8_ + 8))->mNumChildren = (uint)lVar14;
    ppaVar32 = (aiNode **)
               operator_new__((ulong)(*(aiNode **)(local_378._40_8_ + 8))->mNumChildren << 3);
    (*(aiNode **)(uVar34 + 8))->mChildren = ppaVar32;
    if (lVar13 != 0) {
      lVar13 = 0;
      do {
        paVar23 = (aiNode *)local_478[lVar13];
        paVar23->mParent = *(aiNode **)(local_378._40_8_ + 8);
        (*(aiNode **)(local_378._40_8_ + 8))->mChildren[lVar13] = paVar23;
        lVar13 = lVar13 + 1;
      } while (lVar14 + (ulong)(lVar14 == 0) != lVar13);
    }
  }
  if (local_478 != (undefined8 *)0x0) {
    operator_delete(local_478);
  }
  local_1c8 = (undefined1  [4])0x3f800000;
  fStack_1c4 = 0.0;
  fStack_1c0 = 0.0;
  fStack_1bc = 0.0;
  aStack_1b8._M_allocated_capacity._0_4_ = 0;
  aStack_1b8._M_local_buf[4] = '\0';
  aStack_1b8._M_allocated_capacity._5_2_ = 0x8000;
  aStack_1b8._7_4_ = 0x3f;
  aStack_1b8._M_local_buf[0xb] = '\0';
  aStack_1b8._12_4_ = 0;
  uStack_1a8 = 0;
  local_1a0 = 1.0;
  local_19c = 0;
  fStack_194 = 0.0;
  fStack_190 = 0.0;
  fStack_18c = 1.0;
  anon_unknown.dwarf_a9e8ec::MakeTreeRelative
            (*(aiNode **)(local_378._40_8_ + 8),(aiMatrix4x4 *)local_1c8);
  ppaVar8 = ppaStack_2c0;
  __src = local_2c8;
  uVar37 = (long)ppaStack_2c0 - (long)local_2c8;
  if (uVar37 != 0) {
    pScene->mNumMeshes = (uint)(uVar37 >> 3);
    __s = (aiMesh **)operator_new__(uVar37 & 0x7fffffff8);
    memset(__s,0,uVar37 & 0x7fffffff8);
    pScene->mMeshes = __s;
    if (ppaVar8 != __src) {
      memmove(__s,__src,uVar37);
      ppaStack_2c0 = __src;
    }
  }
  ppaVar9 = local_2a8;
  __src_00 = ppaStack_2b0;
  uVar37 = (long)local_2a8 - (long)ppaStack_2b0;
  if (uVar37 != 0) {
    pScene->mNumMaterials = (uint)(uVar37 >> 3);
    __s_00 = (aiMaterial **)operator_new__(uVar37 & 0x7fffffff8);
    memset(__s_00,0,uVar37 & 0x7fffffff8);
    pScene->mMaterials = __s_00;
    if (ppaVar9 != __src_00) {
      memmove(__s_00,__src_00,uVar37);
      local_2a8 = __src_00;
    }
  }
  fVar64 = (float)(double)local_378._0_8_;
  fVar40 = 0.0 - fVar64;
  fVar53 = (float)(double)local_378._48_8_;
  fVar61 = (float)(double)local_378._56_8_;
  fVar42 = (float)(double)local_378._80_8_;
  fVar51 = fVar64 + 0.0;
  fVar47 = (float)(double)local_378._88_8_;
  fVar55 = (float)local_308;
  fVar46 = fVar64 * 0.0 + 0.0;
  fVar48 = (float)dStack_300;
  fVar65 = fVar64 * -4.371139e-08 + 0.0;
  fVar43 = (float)(double)local_378._64_8_;
  fVar49 = (float)(double)local_378._96_8_;
  fVar44 = (float)local_2f8;
  fVar60 = fVar46 + 0.0;
  fVar64 = (float)local_2f0;
  fVar41 = (float)(double)local_378._72_8_;
  fVar56 = (float)(double)local_378._104_8_;
  fVar59 = fVar65 + 0.0;
  local_40c = fVar53 * fVar60 + fVar46 * fVar42 + fVar55 * fVar60 + (float)dStack_2e8;
  fVar57 = (float)dStack_2e8 * 0.0;
  fVar45 = fVar53 * fVar51 + fVar46 * fVar42 + fVar55 * fVar60 + fVar57;
  fVar66 = fVar55 * fVar51 + fVar65 * fVar42 + fVar53 * fVar46 + fVar57;
  fVar57 = fVar55 * fVar59 + fVar42 * fVar40 + fVar53 * fVar46 + fVar57;
  fVar62 = fVar61 * fVar60 + fVar46 * fVar47 + fVar48 * fVar60 + (float)(double)local_2e0;
  local_458 = (_Base_ptr)CONCAT44(local_458._4_4_,fVar62);
  fVar58 = (float)(double)local_2e0 * 0.0;
  fVar52 = fVar61 * fVar51 + fVar46 * fVar47 + fVar48 * fVar60 + fVar58;
  fVar67 = fVar48 * fVar51 + fVar65 * fVar47 + fVar61 * fVar46 + fVar58;
  fVar58 = fVar48 * fVar59 + fVar47 * fVar40 + fVar61 * fVar46 + fVar58;
  fVar61 = fVar43 * fVar60 + fVar46 * fVar49 + fVar44 * fVar60 + (float)(double)_Stack_2d8._M_w;
  fVar50 = (float)(double)_Stack_2d8._M_w * 0.0;
  fVar54 = fVar43 * fVar51 + fVar46 * fVar49 + fVar44 * fVar60 + fVar50;
  fVar68 = fVar44 * fVar51 + fVar65 * fVar49 + fVar43 * fVar46 + fVar50;
  fVar50 = fVar44 * fVar59 + fVar49 * fVar40 + fVar43 * fVar46 + fVar50;
  fVar69 = (float)local_2d0 * 0.0;
  fVar63 = fVar41 * fVar51 + fVar46 * fVar56 + fVar64 * fVar60 + fVar69;
  fVar65 = fVar51 * fVar64 + fVar65 * fVar56 + fVar46 * fVar41 + fVar69;
  fVar69 = fVar59 * fVar64 + fVar40 * fVar56 + fVar46 * fVar41 + fVar69;
  fVar60 = fVar60 * fVar41 + fVar46 * fVar56 + fVar64 * fVar60 + (float)local_2d0;
  paVar23 = pScene->mRootNode;
  fVar40 = (paVar23->mTransformation).b1;
  fVar64 = (paVar23->mTransformation).a1;
  fVar41 = (paVar23->mTransformation).c1;
  fVar42 = (paVar23->mTransformation).d1;
  local_410 = fVar42 * fVar63 + fVar41 * fVar54 + fVar64 * fVar45 + fVar52 * fVar40;
  fVar43 = (paVar23->mTransformation).b2;
  fVar44 = (paVar23->mTransformation).a2;
  fVar46 = (paVar23->mTransformation).c2;
  fVar47 = (paVar23->mTransformation).d2;
  local_414 = fVar47 * fVar63 + fVar46 * fVar54 + fVar44 * fVar45 + fVar52 * fVar43;
  fVar48 = (paVar23->mTransformation).b3;
  fVar49 = (paVar23->mTransformation).a3;
  fVar51 = (paVar23->mTransformation).c3;
  local_42c = (paVar23->mTransformation).d3;
  local_418 = local_42c * fVar63 + fVar51 * fVar54 + fVar49 * fVar45 + fVar52 * fVar48;
  fVar53 = (paVar23->mTransformation).b4;
  fVar55 = (paVar23->mTransformation).a4;
  fVar56 = (paVar23->mTransformation).c4;
  fVar59 = (paVar23->mTransformation).d4;
  local_41c = fVar63 * fVar59 + fVar54 * fVar56 + fVar45 * fVar55 + fVar52 * fVar53;
  local_420 = fVar42 * fVar65 + fVar41 * fVar68 + fVar64 * fVar66 + fVar67 * fVar40;
  local_424 = fVar47 * fVar65 + fVar46 * fVar68 + fVar44 * fVar66 + fVar67 * fVar43;
  local_428 = local_42c * fVar65 + fVar51 * fVar68 + fVar49 * fVar66 + fVar67 * fVar48;
  (paVar23->mTransformation).a1 = local_410;
  (paVar23->mTransformation).a2 = local_414;
  (paVar23->mTransformation).a3 = local_418;
  (paVar23->mTransformation).a4 = local_41c;
  (paVar23->mTransformation).b1 = local_420;
  (paVar23->mTransformation).b2 = local_424;
  (paVar23->mTransformation).b3 = local_428;
  (paVar23->mTransformation).b4 =
       fVar65 * fVar59 + fVar68 * fVar56 + fVar66 * fVar55 + fVar67 * fVar53;
  (paVar23->mTransformation).c1 =
       fVar42 * fVar69 + fVar41 * fVar50 + fVar64 * fVar57 + fVar58 * fVar40;
  (paVar23->mTransformation).c2 =
       fVar47 * fVar69 + fVar46 * fVar50 + fVar44 * fVar57 + fVar58 * fVar43;
  (paVar23->mTransformation).c3 =
       local_42c * fVar69 + fVar51 * fVar50 + fVar49 * fVar57 + fVar58 * fVar48;
  (paVar23->mTransformation).c4 =
       fVar69 * fVar59 + fVar50 * fVar56 + fVar57 * fVar55 + fVar58 * fVar53;
  (paVar23->mTransformation).d1 =
       fVar42 * fVar60 + fVar41 * fVar61 + fVar64 * local_40c + fVar40 * fVar62;
  (paVar23->mTransformation).d2 =
       fVar47 * fVar60 + fVar46 * fVar61 + fVar44 * local_40c + fVar43 * fVar62;
  (paVar23->mTransformation).d3 =
       local_42c * fVar60 + fVar51 * fVar61 + fVar49 * local_40c + fVar48 * fVar62;
  (paVar23->mTransformation).d4 =
       fVar60 * fVar59 + fVar61 * fVar56 + local_40c * fVar55 + fVar62 * fVar53;
  bVar39 = DefaultLogger::isNullLogger();
  if (!bVar39) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"STEP: evaluated ",0x10)
    ;
    std::ostream::_M_insert<unsigned_long>((ulong)local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8," object records",0xf);
    LogFunctions<Assimp::IFCImporter>::LogDebug((format *)local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    std::ios_base::~ios_base(local_158);
  }
  Assimp::IFC::ConversionData::~ConversionData((ConversionData *)local_378);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
               *)local_3e8);
  if (db_00 != (DB *)0x0) {
    STEP::DB::~DB(db_00);
    operator_delete(db_00);
  }
  if (local_3b8._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b8._M_refcount._M_pi);
  }
  return;
}

Assistant:

void IFCImporter::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler)
{
    std::shared_ptr<IOStream> stream(pIOHandler->Open(pFile));
    if (!stream) {
        ThrowException("Could not open file for reading");
    }


    // if this is a ifczip file, decompress its contents first
    if(GetExtension(pFile) == "ifczip") {
#ifndef ASSIMP_BUILD_NO_COMPRESSED_IFC
        unzFile zip = unzOpen( pFile.c_str() );
        if(zip == NULL) {
            ThrowException("Could not open ifczip file for reading, unzip failed");
        }

        // chop 'zip' postfix
        std::string fileName = pFile.substr(0,pFile.length() - 3);

        std::string::size_type s = pFile.find_last_of('\\');
        if(s == std::string::npos) {
            s = pFile.find_last_of('/');
        }
        if(s != std::string::npos) {
            fileName = fileName.substr(s+1);
        }

        // search file (same name as the IFCZIP except for the file extension) and place file pointer there
        if(UNZ_OK == unzGoToFirstFile(zip)) {
            do {
                // get file size, etc.
                unz_file_info fileInfo;
                char filename[256];
                unzGetCurrentFileInfo( zip , &fileInfo, filename, sizeof(filename), 0, 0, 0, 0 );
                if (GetExtension(filename) != "ifc") {
                    continue;
                }
                uint8_t* buff = new uint8_t[fileInfo.uncompressed_size];
                LogInfo("Decompressing IFCZIP file");
                unzOpenCurrentFile(zip);
                size_t total = 0;
                int read = 0;
                do {
                    int bufferSize = fileInfo.uncompressed_size < INT16_MAX ? fileInfo.uncompressed_size : INT16_MAX;
                    void* buffer = malloc(bufferSize);
                    read = unzReadCurrentFile(zip, buffer, bufferSize);
                    if (read > 0) {
                        memcpy((char*)buff + total, buffer, read);
                        total += read;
                    }
                    free(buffer);
                } while (read > 0);
                size_t filesize = fileInfo.uncompressed_size;
                if (total == 0 || size_t(total) != filesize)
                {
                    delete[] buff;
                    ThrowException("Failed to decompress IFC ZIP file");
                }
                unzCloseCurrentFile( zip );
                stream.reset(new MemoryIOStream(buff,fileInfo.uncompressed_size,true));
                break;

                if (unzGoToNextFile(zip) == UNZ_END_OF_LIST_OF_FILE) {
                    ThrowException("Found no IFC file member in IFCZIP file (1)");
                }

            } while(true);
        }
        else {
            ThrowException("Found no IFC file member in IFCZIP file (2)");
        }

        unzClose(zip);
#else
        ThrowException("Could not open ifczip file for reading, assimp was built without ifczip support");
#endif
    }

    std::unique_ptr<STEP::DB> db(STEP::ReadFileHeader(stream));
    const STEP::HeaderInfo& head = static_cast<const STEP::DB&>(*db).GetHeader();

    if(!head.fileSchema.size() || head.fileSchema.substr(0,3) != "IFC") {
        ThrowException("Unrecognized file schema: " + head.fileSchema);
    }

    if (!DefaultLogger::isNullLogger()) {
        LogDebug("File schema is \'" + head.fileSchema + '\'');
        if (head.timestamp.length()) {
            LogDebug("Timestamp \'" + head.timestamp + '\'');
        }
        if (head.app.length()) {
            LogDebug("Application/Exporter identline is \'" + head.app  + '\'');
        }
    }

    // obtain a copy of the machine-generated IFC scheme
    ::Assimp::STEP::EXPRESS::ConversionSchema schema;
    Schema_2x3::GetSchema(schema);

    // tell the reader which entity types to track with special care
    static const char* const types_to_track[] = {
        "ifcsite", "ifcbuilding", "ifcproject"
    };

    // tell the reader for which types we need to simulate STEPs reverse indices
    static const char* const inverse_indices_to_track[] = {
        "ifcrelcontainedinspatialstructure", "ifcrelaggregates", "ifcrelvoidselement", "ifcreldefinesbyproperties", "ifcpropertyset", "ifcstyleditem"
    };

    // feed the IFC schema into the reader and pre-parse all lines
    STEP::ReadFile(*db, schema, types_to_track, inverse_indices_to_track);
    const STEP::LazyObject* proj =  db->GetObject("ifcproject");
    if (!proj) {
        ThrowException("missing IfcProject entity");
    }

    ConversionData conv(*db,proj->To<Schema_2x3::IfcProject>(),pScene,settings);
    SetUnits(conv);
    SetCoordinateSpace(conv);
    ProcessSpatialStructures(conv);
    MakeTreeRelative(conv);

    // NOTE - this is a stress test for the importer, but it works only
    // in a build with no entities disabled. See
    //     scripts/IFCImporter/CPPGenerator.py
    // for more information.
    #ifdef ASSIMP_IFC_TEST
        db->EvaluateAll();
    #endif

    // do final data copying
    if (conv.meshes.size()) {
        pScene->mNumMeshes = static_cast<unsigned int>(conv.meshes.size());
        pScene->mMeshes = new aiMesh*[pScene->mNumMeshes]();
        std::copy(conv.meshes.begin(),conv.meshes.end(),pScene->mMeshes);

        // needed to keep the d'tor from burning us
        conv.meshes.clear();
    }

    if (conv.materials.size()) {
        pScene->mNumMaterials = static_cast<unsigned int>(conv.materials.size());
        pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials]();
        std::copy(conv.materials.begin(),conv.materials.end(),pScene->mMaterials);

        // needed to keep the d'tor from burning us
        conv.materials.clear();
    }

    // apply world coordinate system (which includes the scaling to convert to meters and a -90 degrees rotation around x)
    aiMatrix4x4 scale, rot;
    aiMatrix4x4::Scaling(static_cast<aiVector3D>(IfcVector3(conv.len_scale)),scale);
    aiMatrix4x4::RotationX(-AI_MATH_HALF_PI_F,rot);

    pScene->mRootNode->mTransformation = rot * scale * conv.wcs * pScene->mRootNode->mTransformation;

    // this must be last because objects are evaluated lazily as we process them
    if ( !DefaultLogger::isNullLogger() ){
        LogDebug((Formatter::format(),"STEP: evaluated ",db->GetEvaluatedObjectCount()," object records"));
    }
}